

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::MutableRepeatedMessage
          (ExtensionSet *this,int number,int index)

{
  Extension *pEVar1;
  LogMessage *pLVar2;
  LogFinisher local_51;
  LogMessage local_50;
  
  pEVar1 = FindOrNull(this,number);
  if (pEVar1 == (Extension *)0x0) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/extension_set.cc"
               ,0x2f7);
    pLVar2 = LogMessage::operator<<(&local_50,"CHECK failed: extension != NULL: ");
    pLVar2 = LogMessage::operator<<(pLVar2,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=(&local_51,pLVar2);
    LogMessage::~LogMessage(&local_50);
  }
  return (MessageLite *)
         ((((pEVar1->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).rep_)->elements
         [index];
}

Assistant:

MessageLite* ExtensionSet::MutableRepeatedMessage(int number, int index) {
  Extension* extension = FindOrNull(number);
  GOOGLE_CHECK(extension != NULL) << "Index out-of-bounds (field is empty).";
  GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, MESSAGE);
  return extension->repeated_message_value->Mutable(index);
}